

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_encoder.c
# Opt level: O2

void stream_encoder_end(lzma_coder_conflict2 *coder,lzma_allocator *allocator)

{
  void **ppvVar1;
  
  lzma_next_end((lzma_next_coder *)&coder->block_encoder,allocator);
  lzma_next_end((lzma_next_coder *)&coder->index_encoder,allocator);
  lzma_index_end(coder->index,allocator);
  for (ppvVar1 = &coder->filters[0].options;
      ((lzma_filter *)(ppvVar1 + -1))->id != 0xffffffffffffffff; ppvVar1 = ppvVar1 + 2) {
    lzma_free(*ppvVar1,allocator);
  }
  lzma_free(coder,allocator);
  return;
}

Assistant:

static void
stream_encoder_end(lzma_coder *coder, lzma_allocator *allocator)
{
	size_t i;

	lzma_next_end(&coder->block_encoder, allocator);
	lzma_next_end(&coder->index_encoder, allocator);
	lzma_index_end(coder->index, allocator);

	for (i = 0; coder->filters[i].id != LZMA_VLI_UNKNOWN; ++i)
		lzma_free(coder->filters[i].options, allocator);

	lzma_free(coder, allocator);
	return;
}